

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O0

void fillInSwapArray(permInfo *pi)

{
  int iVar1;
  swapInfo *x_00;
  swapInfo *x;
  int counter;
  permInfo *pi_local;
  
  x._4_4_ = pi->totalSwaps;
  x_00 = setSwapInfoPtr(pi->varN);
  while( true ) {
    x._4_4_ = x._4_4_ + -1;
    iVar1 = nextSwap(x_00);
    if (iVar1 != 1) break;
    if (x_00->positionToSwap1 < x_00->positionToSwap2) {
      pi->swapArray[x._4_4_] = x_00->positionToSwap1;
    }
    else {
      pi->swapArray[x._4_4_] = x_00->positionToSwap2;
    }
  }
  freeSwapInfoPtr(x_00);
  return;
}

Assistant:

void fillInSwapArray(permInfo* pi)
{
    int counter=pi->totalSwaps-1;
    swapInfo* x= setSwapInfoPtr(pi->varN);
    while(nextSwap(x)==1)
    {
        if(x->positionToSwap1<x->positionToSwap2)
            pi->swapArray[counter--]=x->positionToSwap1;
        else
            pi->swapArray[counter--]=x->positionToSwap2;
    }
    
    freeSwapInfoPtr(x);    
}